

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void highbd_build_directional_and_filter_intra_predictors
               (uint8_t *ref8,int ref_stride,uint8_t *dst8,int dst_stride,PREDICTION_MODE mode,
               int p_angle,FILTER_INTRA_MODE filter_intra_mode,TX_SIZE tx_size,
               int disable_edge_filter,int n_top_px,int n_topright_px,int n_left_px,
               int n_bottomleft_px,int intra_edge_filter_type,int bit_depth)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ushort *__src;
  ushort *puVar10;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  char in_stack_00000008;
  byte in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  int n_px_3;
  int n_px_2;
  int n_px_1;
  int strength_1;
  int n_px;
  int strength;
  int ab_le;
  int need_bottom;
  int need_right;
  int upsample_left;
  int upsample_above;
  int num_top_pixels_needed;
  int num_left_pixels_needed;
  int val;
  int base;
  int use_filter_intra;
  int is_dr_mode;
  uint16_t *left_ref;
  uint16_t *above_ref;
  int need_above_left;
  int need_above;
  int need_left;
  int txhpx;
  int txwpx;
  uint16_t *left_col;
  uint16_t *above_row;
  uint16_t above_data [160];
  uint16_t left_data [160];
  uint16_t *ref;
  uint16_t *dst;
  int i;
  int in_stack_0000052c;
  uint16_t *in_stack_00000530;
  uint16_t *in_stack_00000538;
  TX_SIZE in_stack_00000547;
  ptrdiff_t in_stack_00000548;
  uint16_t *in_stack_00000550;
  int in_stack_00000560;
  int local_36c;
  int local_364;
  int local_35c;
  int local_354;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffccc;
  TX_SIZE tx_size_00;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffd00;
  undefined1 local_2b8 [30];
  ushort local_29a;
  uint16_t auStack_298 [144];
  undefined1 local_178 [30];
  ushort local_15a;
  uint16_t auStack_158 [144];
  long local_38;
  void *local_30;
  int local_28;
  int local_24;
  int local_1c;
  int local_c;
  
  tx_size_00 = (TX_SIZE)((uint)in_stack_fffffffffffffccc >> 0x18);
  local_30 = (void *)(in_RDX << 1);
  local_38 = in_RDI * 2;
  local_36c = tx_size_wide[in_stack_00000010];
  iVar9 = tx_size_high[in_stack_00000010];
  bVar3 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 2;
  bVar4 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 4;
  bVar5 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 0x10;
  __src = (ushort *)(local_38 + (long)in_ESI * -2);
  puVar10 = (ushort *)(local_38 + -2);
  local_24 = in_R9D;
  local_1c = in_ECX;
  local_c = in_ESI;
  iVar6 = av1_is_directional_mode(in_R8B);
  uVar8 = (uint)(in_stack_00000008 != '\x05');
  iVar7 = 0x80 << ((char)in_stack_00000048 - 8U & 0x1f);
  aom_memset16(local_178,iVar7 + 1,0xa0);
  aom_memset16(local_2b8,iVar7 + -1,0xa0);
  if (iVar6 != 0) {
    bVar3 = 0x5a < local_24;
    bVar4 = local_24 < 0xb4;
    bVar5 = 1;
  }
  if (uVar8 != 0) {
    bVar5 = 1;
    bVar4 = 1;
    bVar3 = 1;
  }
  if (((bVar4 == 0) && (in_stack_00000030 == 0)) || ((bVar3 == 0 && (in_stack_00000020 == 0)))) {
    if (bVar3 == 0) {
      if (in_stack_00000030 < 1) {
        uVar8 = iVar7 - 1;
      }
      else {
        uVar8 = (uint)*puVar10;
      }
    }
    else if (in_stack_00000020 < 1) {
      uVar8 = iVar7 + 1;
    }
    else {
      uVar8 = (uint)*__src;
    }
    for (local_28 = 0; local_28 < iVar9; local_28 = local_28 + 1) {
      aom_memset16(local_30,uVar8,(long)local_36c);
      local_30 = (void *)((long)local_30 + (long)local_1c * 2);
    }
  }
  else {
    if (bVar3 != 0) {
      in_stack_fffffffffffffcbc = local_36c;
      if (in_stack_00000038 < 0) {
        in_stack_fffffffffffffcbc = 0;
      }
      iVar6 = iVar9 + in_stack_fffffffffffffcbc;
      local_28 = 0;
      in_stack_fffffffffffffcc0 = iVar9;
      if (in_stack_00000030 < 1) {
        if (0 < in_stack_00000020) {
          aom_memset16(auStack_158,(uint)*__src,(long)iVar6);
        }
      }
      else {
        for (; local_28 < in_stack_00000030; local_28 = local_28 + 1) {
          auStack_158[local_28] = puVar10[local_28 * local_c];
        }
        if (0 < in_stack_00000038) {
          for (; local_28 < iVar9 + in_stack_00000038; local_28 = local_28 + 1) {
            auStack_158[local_28] = puVar10[local_28 * local_c];
          }
        }
        if (local_28 < iVar6) {
          aom_memset16(auStack_158 + local_28,(uint)auStack_158[local_28 + -1],
                       (long)(iVar6 - local_28));
        }
      }
    }
    if (bVar4 != 0) {
      in_stack_fffffffffffffcb4 = iVar9;
      if (in_stack_00000028 < 0) {
        in_stack_fffffffffffffcb4 = 0;
      }
      iVar6 = local_36c + in_stack_fffffffffffffcb4;
      in_stack_fffffffffffffcb8 = local_36c;
      if (in_stack_00000020 < 1) {
        if (0 < in_stack_00000030) {
          aom_memset16(auStack_298,(uint)*puVar10,(long)iVar6);
        }
      }
      else {
        memcpy(auStack_298,__src,(long)in_stack_00000020 << 1);
        local_28 = in_stack_00000020;
        if (0 < in_stack_00000028) {
          memcpy(auStack_298 + local_36c,__src + local_36c,(long)in_stack_00000028 << 1);
          local_28 = in_stack_00000028 + local_28;
        }
        if (local_28 < iVar6) {
          aom_memset16(auStack_298 + local_28,(uint)auStack_298[local_28 + -1],
                       (long)(iVar6 - local_28));
        }
      }
    }
    if (bVar5 != 0) {
      if ((in_stack_00000020 < 1) || (in_stack_00000030 < 1)) {
        if (in_stack_00000020 < 1) {
          if (in_stack_00000030 < 1) {
            local_29a = (ushort)iVar7;
          }
          else {
            local_29a = *puVar10;
          }
        }
        else {
          local_29a = *__src;
        }
      }
      else {
        local_29a = __src[-1];
      }
      local_15a = local_29a;
    }
    if (uVar8 == 0) {
      if (in_stack_00000018 == 0) {
        bVar1 = 0x59 < local_24;
        bVar2 = local_24 < 0xb5;
        if ((local_24 != 0x5a) && (local_24 != 0xb4)) {
          if ((bVar4 != 0) && ((bVar3 != 0 && (0x17 < local_36c + iVar9)))) {
            highbd_filter_intra_edge_corner(auStack_298,auStack_158);
          }
          if ((bVar4 != 0) && (0 < in_stack_00000020)) {
            iVar6 = intra_edge_filter_strength(local_36c,iVar9,local_24 + -0x5a,in_stack_00000040);
            local_354 = iVar9;
            if (bVar1) {
              local_354 = 0;
            }
            in_stack_fffffffffffffcdc = in_stack_00000020 + 1 + local_354;
            (*av1_highbd_filter_intra_edge)(&local_29a,in_stack_fffffffffffffcdc,iVar6);
          }
          if ((bVar3 != 0) && (0 < in_stack_00000030)) {
            in_stack_fffffffffffffcd8 =
                 intra_edge_filter_strength(iVar9,local_36c,local_24 + -0xb4,in_stack_00000040);
            local_35c = local_36c;
            if (bVar2) {
              local_35c = 0;
            }
            in_stack_fffffffffffffcd4 = in_stack_00000030 + 1 + local_35c;
            (*av1_highbd_filter_intra_edge)
                      (&local_15a,in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd8);
          }
        }
        iVar6 = av1_use_intra_edge_upsample(local_36c,iVar9,local_24 + -0x5a,in_stack_00000040);
        if ((bVar4 != 0) && (iVar6 != 0)) {
          local_364 = iVar9;
          if (bVar1) {
            local_364 = 0;
          }
          in_stack_fffffffffffffcd0 = local_36c + local_364;
          (*av1_highbd_upsample_intra_edge)(auStack_298,in_stack_fffffffffffffcd0,in_stack_00000048)
          ;
        }
        iVar6 = av1_use_intra_edge_upsample(iVar9,local_36c,local_24 + -0xb4,in_stack_00000040);
        if ((bVar3 != 0) && (iVar6 != 0)) {
          if (bVar2) {
            local_36c = 0;
          }
          iVar9 = iVar9 + local_36c;
          (*av1_highbd_upsample_intra_edge)(auStack_158,iVar9,in_stack_00000048);
          tx_size_00 = (TX_SIZE)((uint)iVar9 >> 0x18);
        }
      }
      highbd_dr_predictor((uint16_t *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),tx_size_00,
                          (uint16_t *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                          (uint16_t *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,in_stack_fffffffffffffd00,uVar8,(int)puVar10);
    }
    else {
      highbd_filter_intra_predictor
                (in_stack_00000550,in_stack_00000548,in_stack_00000547,in_stack_00000538,
                 in_stack_00000530,in_stack_0000052c,in_stack_00000560);
    }
  }
  return;
}

Assistant:

static void highbd_build_directional_and_filter_intra_predictors(
    const uint8_t *ref8, int ref_stride, uint8_t *dst8, int dst_stride,
    PREDICTION_MODE mode, int p_angle, FILTER_INTRA_MODE filter_intra_mode,
    TX_SIZE tx_size, int disable_edge_filter, int n_top_px, int n_topright_px,
    int n_left_px, int n_bottomleft_px, int intra_edge_filter_type,
    int bit_depth) {
  int i;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const uint16_t *const ref = CONVERT_TO_SHORTPTR(ref8);
  DECLARE_ALIGNED(16, uint16_t, left_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  DECLARE_ALIGNED(16, uint16_t, above_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  uint16_t *const above_row = above_data + 16;
  uint16_t *const left_col = left_data + 16;
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  int need_left = extend_modes[mode] & NEED_LEFT;
  int need_above = extend_modes[mode] & NEED_ABOVE;
  int need_above_left = extend_modes[mode] & NEED_ABOVELEFT;
  const uint16_t *above_ref = ref - ref_stride;
  const uint16_t *left_ref = ref - 1;
  const int is_dr_mode = av1_is_directional_mode(mode);
  const int use_filter_intra = filter_intra_mode != FILTER_INTRA_MODES;
  assert(use_filter_intra || is_dr_mode);
  const int base = 128 << (bit_depth - 8);
  // The left_data, above_data buffers must be zeroed to fix some intermittent
  // valgrind errors. Uninitialized reads in intra pred modules (e.g. width = 4
  // path in av1_highbd_dr_prediction_z2_avx2()) from left_data, above_data are
  // seen to be the potential reason for this issue.
  aom_memset16(left_data, base + 1, NUM_INTRA_NEIGHBOUR_PIXELS);
  aom_memset16(above_data, base - 1, NUM_INTRA_NEIGHBOUR_PIXELS);

  // The default values if ref pixels are not available:
  // base   base-1 base-1 .. base-1 base-1 base-1 base-1 base-1 base-1
  // base+1   A      B  ..     Y      Z
  // base+1   C      D  ..     W      X
  // base+1   E      F  ..     U      V
  // base+1   G      H  ..     S      T      T      T      T      T

  if (is_dr_mode) {
    if (p_angle <= 90)
      need_above = 1, need_left = 0, need_above_left = 1;
    else if (p_angle < 180)
      need_above = 1, need_left = 1, need_above_left = 1;
    else
      need_above = 0, need_left = 1, need_above_left = 1;
  }
  if (use_filter_intra) need_left = need_above = need_above_left = 1;

  assert(n_top_px >= 0);
  assert(n_topright_px >= -1);
  assert(n_left_px >= 0);
  assert(n_bottomleft_px >= -1);

  if ((!need_above && n_left_px == 0) || (!need_left && n_top_px == 0)) {
    int val;
    if (need_left) {
      val = (n_top_px > 0) ? above_ref[0] : base + 1;
    } else {
      val = (n_left_px > 0) ? left_ref[0] : base - 1;
    }
    for (i = 0; i < txhpx; ++i) {
      aom_memset16(dst, val, txwpx);
      dst += dst_stride;
    }
    return;
  }

  // NEED_LEFT
  if (need_left) {
    const int num_left_pixels_needed =
        txhpx + (n_bottomleft_px >= 0 ? txwpx : 0);
    i = 0;
    if (n_left_px > 0) {
      for (; i < n_left_px; i++) left_col[i] = left_ref[i * ref_stride];
      if (n_bottomleft_px > 0) {
        assert(i == txhpx);
        for (; i < txhpx + n_bottomleft_px; i++)
          left_col[i] = left_ref[i * ref_stride];
      }
      if (i < num_left_pixels_needed)
        aom_memset16(&left_col[i], left_col[i - 1], num_left_pixels_needed - i);
    } else if (n_top_px > 0) {
      aom_memset16(left_col, above_ref[0], num_left_pixels_needed);
    }
  }

  // NEED_ABOVE
  if (need_above) {
    const int num_top_pixels_needed = txwpx + (n_topright_px >= 0 ? txhpx : 0);
    if (n_top_px > 0) {
      memcpy(above_row, above_ref, n_top_px * sizeof(above_ref[0]));
      i = n_top_px;
      if (n_topright_px > 0) {
        assert(n_top_px == txwpx);
        memcpy(above_row + txwpx, above_ref + txwpx,
               n_topright_px * sizeof(above_ref[0]));
        i += n_topright_px;
      }
      if (i < num_top_pixels_needed)
        aom_memset16(&above_row[i], above_row[i - 1],
                     num_top_pixels_needed - i);
    } else if (n_left_px > 0) {
      aom_memset16(above_row, left_ref[0], num_top_pixels_needed);
    }
  }

  if (need_above_left) {
    if (n_top_px > 0 && n_left_px > 0) {
      above_row[-1] = above_ref[-1];
    } else if (n_top_px > 0) {
      above_row[-1] = above_ref[0];
    } else if (n_left_px > 0) {
      above_row[-1] = left_ref[0];
    } else {
      above_row[-1] = base;
    }
    left_col[-1] = above_row[-1];
  }

  if (use_filter_intra) {
    highbd_filter_intra_predictor(dst, dst_stride, tx_size, above_row, left_col,
                                  filter_intra_mode, bit_depth);
    return;
  }

  assert(is_dr_mode);
  int upsample_above = 0;
  int upsample_left = 0;
  if (!disable_edge_filter) {
    const int need_right = p_angle < 90;
    const int need_bottom = p_angle > 180;
    if (p_angle != 90 && p_angle != 180) {
      assert(need_above_left);
      const int ab_le = 1;
      if (need_above && need_left && (txwpx + txhpx >= 24)) {
        highbd_filter_intra_edge_corner(above_row, left_col);
      }
      if (need_above && n_top_px > 0) {
        const int strength = intra_edge_filter_strength(
            txwpx, txhpx, p_angle - 90, intra_edge_filter_type);
        const int n_px = n_top_px + ab_le + (need_right ? txhpx : 0);
        av1_highbd_filter_intra_edge(above_row - ab_le, n_px, strength);
      }
      if (need_left && n_left_px > 0) {
        const int strength = intra_edge_filter_strength(
            txhpx, txwpx, p_angle - 180, intra_edge_filter_type);
        const int n_px = n_left_px + ab_le + (need_bottom ? txwpx : 0);
        av1_highbd_filter_intra_edge(left_col - ab_le, n_px, strength);
      }
    }
    upsample_above = av1_use_intra_edge_upsample(txwpx, txhpx, p_angle - 90,
                                                 intra_edge_filter_type);
    if (need_above && upsample_above) {
      const int n_px = txwpx + (need_right ? txhpx : 0);
      av1_highbd_upsample_intra_edge(above_row, n_px, bit_depth);
    }
    upsample_left = av1_use_intra_edge_upsample(txhpx, txwpx, p_angle - 180,
                                                intra_edge_filter_type);
    if (need_left && upsample_left) {
      const int n_px = txhpx + (need_bottom ? txwpx : 0);
      av1_highbd_upsample_intra_edge(left_col, n_px, bit_depth);
    }
  }
  highbd_dr_predictor(dst, dst_stride, tx_size, above_row, left_col,
                      upsample_above, upsample_left, p_angle, bit_depth);
}